

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv_relation.cpp
# Opt level: O2

void __thiscall
duckdb::ReadCSVRelation::ReadCSVRelation
          (ReadCSVRelation *this,shared_ptr<duckdb::ClientContext,_true> *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *input,named_parameter_map_t *options,string *alias_p)

{
  vector<duckdb::ColumnDefinition,_true> *this_00;
  ClientContext *this_01;
  mapped_type *this_02;
  reference pvVar1;
  string *__x;
  LogicalType *this_03;
  ulong __n;
  initializer_list<duckdb::Value> __l;
  child_list_t<Value> column_names;
  _Any_data local_638;
  code *local_628;
  code *pcStack_620;
  shared_ptr<duckdb::Relation,_true> local_5d8;
  vector<duckdb::Value,_true> local_5c0;
  Value local_5a8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_568;
  string local_550;
  Value local_530;
  string local_4f0;
  MultiFileOptions file_options;
  CSVReaderOptions csv_options;
  
  ::std::__cxx11::string::string((string *)&local_550,"read_csv_auto",(allocator *)&file_options);
  MultiFileReader::CreateValueFromFileList((Value *)&csv_options,input);
  __l._M_len = 1;
  __l._M_array = (iterator)&csv_options;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_5c0,__l,
             (allocator_type *)local_638._M_pod_data);
  local_5d8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_5d8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  TableFunctionRelation::TableFunctionRelation
            (&this->super_TableFunctionRelation,context,&local_550,&local_5c0,&local_5d8,false);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5d8.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_5c0);
  Value::~Value((Value *)&csv_options);
  ::std::__cxx11::string::~string((string *)&local_550);
  (this->super_TableFunctionRelation).super_Relation._vptr_Relation =
       (_func_int **)&PTR__ReadCSVRelation_027c0fe0;
  ::std::__cxx11::string::string((string *)&this->alias,(string *)alias_p);
  MultiFileOptions::MultiFileOptions(&file_options);
  InitializeAlias(this,input);
  CSVReaderOptions::CSVReaderOptions(&csv_options);
  this_01 = shared_ptr<duckdb::ClientContext,_true>::operator->(context);
  local_628 = (code *)0x0;
  pcStack_620 = (code *)0x0;
  local_638._M_unused._M_object = (void *)0x0;
  local_638._8_8_ = 0;
  local_638._M_unused._M_object = operator_new(0x30);
  *(CSVReaderOptions **)local_638._M_unused._0_8_ = &csv_options;
  *(shared_ptr<duckdb::ClientContext,_true> **)((long)local_638._M_unused._0_8_ + 8) = context;
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> **
   )((long)local_638._M_unused._0_8_ + 0x10) = input;
  *(named_parameter_map_t **)((long)local_638._M_unused._0_8_ + 0x18) = options;
  *(ReadCSVRelation **)((long)local_638._M_unused._0_8_ + 0x20) = this;
  *(MultiFileOptions **)((long)local_638._M_unused._0_8_ + 0x28) = &file_options;
  pcStack_620 = ::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/relation/read_csv_relation.cpp:110:6)>
                ::_M_invoke;
  local_628 = ::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/relation/read_csv_relation.cpp:110:6)>
              ::_M_manager;
  ClientContext::RunFunctionInTransaction(this_01,(function<void_()> *)&local_638,true);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_638);
  CSVReaderOptions::ToNamedParameters(&csv_options,options);
  Value::BOOLEAN((Value *)&local_638,false);
  ::std::__cxx11::string::string((string *)&local_5a8,"auto_detect",(allocator *)&column_names);
  this_02 = ::std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)options,(key_type *)&local_5a8);
  Value::operator=(this_02,(Value *)&local_638);
  ::std::__cxx11::string::~string((string *)&local_5a8);
  Value::~Value((Value *)&local_638);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->super_TableFunctionRelation).named_parameters._M_h,&options->_M_h);
  column_names.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  column_names.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  column_names.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_TableFunctionRelation).columns;
  for (__n = 0; __n < (ulong)(((long)(this->super_TableFunctionRelation).columns.
                                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     .
                                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->super_TableFunctionRelation).columns.
                                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                    .
                                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0xd8);
      __n = __n + 1) {
    pvVar1 = vector<duckdb::ColumnDefinition,_true>::get<true>(this_00,__n);
    __x = ColumnDefinition::Name_abi_cxx11_(pvVar1);
    pvVar1 = vector<duckdb::ColumnDefinition,_true>::get<true>(this_00,__n);
    this_03 = ColumnDefinition::Type(pvVar1);
    LogicalType::ToString_abi_cxx11_(&local_4f0,this_03);
    Value::Value(&local_5a8,&local_4f0);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::pair<duckdb::Value,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                *)&local_638,__x,&local_5a8);
    ::std::
    vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
    ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
              ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                *)&column_names,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                *)&local_638);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
             *)&local_638);
    Value::~Value(&local_5a8);
    ::std::__cxx11::string::~string((string *)&local_4f0);
  }
  if (file_options.union_by_name == false) {
    ::std::__cxx11::string::string
              ((string *)local_638._M_pod_data,"columns",(allocator *)&local_5a8);
    local_568.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         column_names.
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         .
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_568.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         column_names.
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         .
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_568.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         column_names.
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         .
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    column_names.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    column_names.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    column_names.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value::STRUCT(&local_530,(child_list_t<Value> *)&local_568);
    TableFunctionRelation::AddNamedParameter
              (&this->super_TableFunctionRelation,(string *)&local_638,&local_530);
    Value::~Value(&local_530);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::~vector(&local_568);
    ::std::__cxx11::string::~string((string *)local_638._M_pod_data);
  }
  ::std::__cxx11::string::string((string *)local_638._M_pod_data,"names",(allocator *)&local_5a8);
  TableFunctionRelation::RemoveNamedParameterIfExists
            (&this->super_TableFunctionRelation,(string *)&local_638);
  ::std::__cxx11::string::~string((string *)local_638._M_pod_data);
  ::std::__cxx11::string::string((string *)local_638._M_pod_data,"types",(allocator *)&local_5a8);
  TableFunctionRelation::RemoveNamedParameterIfExists
            (&this->super_TableFunctionRelation,(string *)&local_638);
  ::std::__cxx11::string::~string((string *)local_638._M_pod_data);
  ::std::__cxx11::string::string((string *)local_638._M_pod_data,"dtypes",(allocator *)&local_5a8);
  TableFunctionRelation::RemoveNamedParameterIfExists
            (&this->super_TableFunctionRelation,(string *)&local_638);
  ::std::__cxx11::string::~string((string *)local_638._M_pod_data);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&column_names.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           );
  CSVReaderOptions::~CSVReaderOptions(&csv_options);
  MultiFileOptions::~MultiFileOptions(&file_options);
  return;
}

Assistant:

ReadCSVRelation::ReadCSVRelation(const shared_ptr<ClientContext> &context, const vector<string> &input,
                                 named_parameter_map_t &&options, string alias_p)
    : TableFunctionRelation(context, "read_csv_auto", {MultiFileReader::CreateValueFromFileList(input)}, nullptr,
                            false),
      alias(std::move(alias_p)) {
	MultiFileOptions file_options;

	InitializeAlias(input);
	CSVReaderOptions csv_options;
	context->RunFunctionInTransaction(
	    [&]() { csv_options = ReadCSVRelationBind(context, input, options, columns, file_options); });

	// Capture the options potentially set/altered by the auto-detection phase
	csv_options.ToNamedParameters(options);

	// No need to auto-detect again
	options["auto_detect"] = Value::BOOLEAN(false);
	SetNamedParameters(std::move(options));

	child_list_t<Value> column_names;
	for (idx_t i = 0; i < columns.size(); i++) {
		column_names.push_back(make_pair(columns[i].Name(), Value(columns[i].Type().ToString())));
	}

	if (!file_options.union_by_name) {
		AddNamedParameter("columns", Value::STRUCT(std::move(column_names)));
	}
	RemoveNamedParameterIfExists("names");
	RemoveNamedParameterIfExists("types");
	RemoveNamedParameterIfExists("dtypes");
}